

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlapGraph.cpp
# Opt level: O3

void __thiscall dgrminer::OverlapGraph::OverlapGraph(OverlapGraph *this,bool heuristic)

{
  _Rb_tree_header *p_Var1;
  
  this->heuristic = heuristic;
  this->newVertex = 0;
  p_Var1 = &(this->vertices)._M_t._M_impl.super__Rb_tree_header;
  (this->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header;
  (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

OverlapGraph::OverlapGraph(bool heuristic) : heuristic(heuristic) {}